

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# div.h
# Opt level: O0

void __thiscall
mp::
DivConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertWithConstResult
          (DivConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ItemType_conflict5 *dc)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  const_reference pvVar1;
  FunctionalConstraint *in_RSI;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  NodeRange NVar2;
  int in_stack_00000094;
  DivConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000098;
  VarArray2 in_stack_000000a0;
  LinTerms lt;
  Arguments *args;
  int r;
  LinTerms *in_stack_fffffffffffffd78;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffd80;
  vector<double,_std::allocator<double>_> *this_00;
  undefined1 fSort;
  LinTerms *le;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *in_stack_fffffffffffffda8;
  AlgConRhs<0> in_stack_fffffffffffffdb0;
  iterator in_stack_fffffffffffffdb8;
  AlgConRhs<0> in_stack_fffffffffffffdc0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffde0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffde8;
  LinTerms *in_stack_fffffffffffffdf0;
  undefined1 local_119 [72];
  LinTerms local_d1;
  Arguments *local_20;
  int local_14;
  FunctionalConstraint *local_10;
  
  local_10 = in_RSI;
  local_14 = FunctionalConstraint::GetResultVar(in_RSI);
  local_20 = CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::DivId>::
             GetArguments((CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::DivId>
                           *)(local_10 + 1));
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  local_d1.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>._1_8_ =
       FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
       ::fixed_value(in_stack_fffffffffffffd80,(int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
  local_d1.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>._9_8_ = 0xbff0000000000000;
  local_d1.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data._17_8_ =
       (long)&local_d1.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr + 1;
  local_d1.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data._1_8_
       = 2;
  le = &local_d1;
  std::allocator<double>::allocator((allocator<double> *)0x2a1963);
  __l._M_len = (size_type)in_stack_fffffffffffffdc0.rhs_;
  __l._M_array = in_stack_fffffffffffffdb8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0.rhs_,__l,
             (allocator_type *)in_stack_fffffffffffffda8);
  pvVar1 = std::array<int,_2UL>::operator[]
                     ((array<int,_2UL> *)in_stack_fffffffffffffd80,
                      (size_type)in_stack_fffffffffffffd78);
  local_119._1_4_ = *pvVar1;
  pvVar1 = std::array<int,_2UL>::operator[]
                     ((array<int,_2UL> *)in_stack_fffffffffffffd80,
                      (size_type)in_stack_fffffffffffffd78);
  local_119._5_4_ = *pvVar1;
  local_119._9_8_ = local_119 + 1;
  local_119._17_8_ = 2;
  this_00 = (vector<double,_std::allocator<double>_> *)local_119;
  std::allocator<int>::allocator((allocator<int> *)0x2a19ea);
  __l_00._M_len = (size_type)in_stack_fffffffffffffdc0.rhs_;
  __l_00._M_array = (iterator)in_stack_fffffffffffffdb8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0.rhs_,__l_00,
             (allocator_type *)in_stack_fffffffffffffda8);
  LinTerms::LinTerms(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::allocator<int>::~allocator((allocator<int> *)0x2a1a47);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::allocator<double>::~allocator((allocator<double> *)0x2a1a61);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  fSort = (undefined1)((ulong)in_RDI >> 0x38);
  LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  AlgConRhs<0>::AlgConRhs((AlgConRhs<0> *)&stack0xfffffffffffffdc0,0.0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            (in_stack_fffffffffffffda8,le,in_stack_fffffffffffffdb0,(bool)fSort);
  NVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)in_stack_fffffffffffffdb0.rhs_,in_stack_fffffffffffffda8);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)NVar2.pvn_);
  LinTerms::~LinTerms((LinTerms *)NVar2.pvn_);
  EnsureDivisorNot0(in_stack_00000098,in_stack_00000094,in_stack_000000a0);
  LinTerms::~LinTerms((LinTerms *)NVar2.pvn_);
  return;
}

Assistant:

void ConvertWithConstResult(const ItemType& dc) {
    auto r = dc.GetResultVar();
    const auto& args = dc.GetArguments();
    /// r = arg0 / arg1,    arg0 = arg1 * r;
    auto lt = LinTerms{
        { GetMC().fixed_value(r), -1.0 },
        { args[1], args[0] }
    };
    GetMC().AddConstraint (LinConEQ( std::move(lt), { 0.0 } ) );
    EnsureDivisorNot0(r, args);
  }